

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qitemdelegate.cpp
# Opt level: O1

void __thiscall
QItemDelegate::drawFocus
          (QItemDelegate *this,QPainter *painter,QStyleOptionViewItem *option,QRect *rect)

{
  undefined8 uVar1;
  QWidget *this_00;
  long *plVar2;
  QStyle *pQVar3;
  long in_FS_OFFSET;
  undefined1 local_78 [16];
  undefined1 *local_68;
  undefined1 *puStack_60;
  undefined1 *local_58;
  QPalettePrivate *pQStack_50;
  undefined1 *local_48;
  QObject *pQStack_40;
  QColor local_38;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if (((((option->super_QStyleOption).state.super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
         super_QFlagsStorage<QStyle::StateFlag>.i & 0x100) != 0) &&
      ((rect->x1).m_i <= (rect->x2).m_i)) && ((rect->y1).m_i <= (rect->y2).m_i)) {
    local_38._0_6_ = 0xaaaaaaaaaaaa;
    local_38.ct.argb.red = 0xaaaa;
    local_38.ct._4_6_ = 0xaaaaaaaaaaaa;
    local_38._14_2_ = 0xaaaa;
    local_48 = &DAT_aaaaaaaaaaaaaaaa;
    pQStack_40 = (QObject *)&DAT_aaaaaaaaaaaaaaaa;
    local_58 = &DAT_aaaaaaaaaaaaaaaa;
    pQStack_50 = (QPalettePrivate *)&DAT_aaaaaaaaaaaaaaaa;
    local_68 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_60 = &DAT_aaaaaaaaaaaaaaaa;
    local_78._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_78._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    QStyleOptionFocusRect::QStyleOptionFocusRect((QStyleOptionFocusRect *)local_78);
    QStyleOption::operator=((QStyleOption *)local_78,&option->super_QStyleOption);
    local_68._0_4_ = (rect->x1).m_i;
    local_68._4_4_ = (rect->y1).m_i;
    puStack_60._0_4_ = (rect->x2).m_i;
    puStack_60._4_4_ = (rect->y2).m_i;
    local_78._8_8_ = local_78._8_8_ | 0x900000;
    plVar2 = (long *)QPalette::brush((int)option + 0x28,
                                     ~(option->super_QStyleOption).state.
                                      super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
                                      super_QFlagsStorage<QStyle::StateFlag>.i & Button);
    uVar1 = *(undefined8 *)(*plVar2 + 8);
    local_38.ct._4_6_ = (undefined6)((ulong)*(undefined8 *)(*plVar2 + 0xe) >> 0x10);
    local_38._0_6_ = SUB86(uVar1,0);
    local_38.ct.argb.red = (ushort)((ulong)uVar1 >> 0x30);
    this_00 = option->widget;
    if (this_00 == (QWidget *)0x0) {
      pQVar3 = QApplication::style();
    }
    else {
      pQVar3 = QWidget::style(this_00);
    }
    (**(code **)(*(long *)pQVar3 + 0xb0))(pQVar3,3,local_78,painter,this_00);
    QStyleOption::~QStyleOption((QStyleOption *)local_78);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QItemDelegate::drawFocus(QPainter *painter,
                              const QStyleOptionViewItem &option,
                              const QRect &rect) const
{
    Q_D(const QItemDelegate);
    if ((option.state & QStyle::State_HasFocus) == 0 || !rect.isValid())
        return;
    QStyleOptionFocusRect o;
    o.QStyleOption::operator=(option);
    o.rect = rect;
    o.state |= QStyle::State_KeyboardFocusChange;
    o.state |= QStyle::State_Item;
    QPalette::ColorGroup cg = (option.state & QStyle::State_Enabled)
                              ? QPalette::Normal : QPalette::Disabled;
    o.backgroundColor = option.palette.color(cg, (option.state & QStyle::State_Selected)
                                             ? QPalette::Highlight : QPalette::Window);
    const QWidget *widget = d->widget(option);
    QStyle *style = widget ? widget->style() : QApplication::style();
    style->drawPrimitive(QStyle::PE_FrameFocusRect, &o, painter, widget);
}